

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool crnd::crnd_validate_file(void *pData,uint32 data_size,crn_file_info *pFile_info)

{
  ulong uVar1;
  uchar uVar2;
  byte bVar3;
  crn_header *pcVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  
  if (pFile_info == (crn_file_info *)0x0) {
LAB_0011123f:
    if (0x3d < data_size && pData != (void *)0x0) {
      pcVar4 = crnd_get_header(pData,data_size);
      uVar14 = 0;
      if (pcVar4 != (crn_header *)0x0) {
        uVar5 = *(ushort *)(pcVar4->m_header_size).m_buf;
        uVar5 = uVar5 << 8 | uVar5 >> 8;
        uVar11 = (uint)uVar5;
        if (uVar5 != 6) {
          uVar8 = 0xffff;
          lVar12 = 6;
          do {
            uVar14 = (uint)(uVar8 >> 8) & 0xff ^ (uint)(pcVar4->m_sig).m_buf[lVar12];
            uVar14 = uVar14 >> 4 ^ uVar14;
            uVar14 = uVar14 << 0xc ^ uVar14 << 5 ^ ((int)uVar8 << 8 | uVar14);
            uVar8 = (ulong)uVar14;
            lVar12 = lVar12 + 1;
          } while (uVar11 != (uint)lVar12);
          uVar14 = ~uVar14 & 0xffff;
        }
        uVar9 = *(ushort *)(pcVar4->m_header_crc16).m_buf;
        uVar13 = 0;
        if ((ushort)(uVar9 << 8 | uVar9 >> 8) != uVar14) goto LAB_001113b6;
        uVar14 = *(uint *)(pcVar4->m_data_size).m_buf;
        uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18
        ;
        if (uVar14 != uVar11) {
          uVar13 = 0xffff;
          lVar12 = 0;
          do {
            uVar15 = (uVar13 & 0xffff) >> 8 ^ (uint)*(byte *)((long)pData + lVar12 + (ulong)uVar5);
            uVar15 = uVar15 >> 4 ^ uVar15;
            uVar13 = uVar15 << 0xc ^ uVar15 << 5 ^ (uVar13 << 8 | uVar15);
            lVar12 = lVar12 + 1;
          } while (uVar14 - uVar11 != (int)lVar12);
          uVar13 = ~uVar13 & 0xffff;
        }
        uVar5 = *(ushort *)(pcVar4->m_data_crc16).m_buf;
        if (((ushort)(uVar5 << 8 | uVar5 >> 8) == uVar13) &&
           ((uVar2 = (pcVar4->m_faces).m_buf[0], uVar2 == '\x06' || (uVar2 == '\x01')))) {
          uVar5 = *(ushort *)(pcVar4->m_width).m_buf;
          uVar5 = uVar5 << 8 | uVar5 >> 8;
          if (0xffffefff < uVar5 - 0x1001) {
            uVar9 = *(ushort *)(pcVar4->m_height).m_buf;
            uVar9 = uVar9 << 8 | uVar9 >> 8;
            if ((0xffffefff < uVar9 - 0x1001) && (bVar3 = (pcVar4->m_levels).m_buf[0], bVar3 != 0))
            {
              uVar15 = 1;
              uVar11 = (uint)uVar9;
              uVar13 = (uint)uVar5;
              if (1 < (uVar9 | uVar5)) {
                do {
                  do {
                    uVar10 = uVar11;
                    uVar6 = uVar13 >> 1;
                    uVar11 = uVar10 >> 1;
                    uVar15 = uVar15 + 1;
                    bVar16 = 3 < uVar13;
                    uVar13 = uVar6;
                  } while (bVar16);
                } while (3 < uVar10);
              }
              if (bVar3 <= uVar15) {
                bVar16 = (pcVar4->m_format).m_buf[0] < 0xf;
                uVar13 = (uint)bVar16;
                if (bVar16 && pFile_info != (crn_file_info *)0x0) {
                  *(uint *)(pFile_info + 4) = uVar14;
                  uVar5 = *(ushort *)(pcVar4->m_header_size).m_buf;
                  *(uint *)(pFile_info + 8) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
                  *(uint *)(pFile_info + 0xc) =
                       ((uint)(pcVar4->m_alpha_selectors).m_size.m_buf[2] |
                       (uint)(pcVar4->m_alpha_selectors).m_size.m_buf[1] << 8 |
                       (uint)(pcVar4->m_alpha_selectors).m_size.m_buf[0] << 0x10) +
                       ((uint)(pcVar4->m_alpha_endpoints).m_size.m_buf[2] |
                       (uint)(pcVar4->m_alpha_endpoints).m_size.m_buf[1] << 8 |
                       (uint)(pcVar4->m_alpha_endpoints).m_size.m_buf[0] << 0x10) +
                       ((uint)(pcVar4->m_color_selectors).m_size.m_buf[2] |
                       (uint)(pcVar4->m_color_selectors).m_size.m_buf[1] << 8 |
                       (uint)(pcVar4->m_color_selectors).m_size.m_buf[0] << 0x10) +
                       ((uint)(pcVar4->m_color_endpoints).m_size.m_buf[2] |
                       (uint)(pcVar4->m_color_endpoints).m_size.m_buf[1] << 8 |
                       (uint)(pcVar4->m_color_endpoints).m_size.m_buf[0] << 0x10);
                  uVar5 = *(ushort *)(pcVar4->m_tables_size).m_buf;
                  *(uint *)(pFile_info + 0x10) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
                  *(uint *)(pFile_info + 0x14) = (uint)(pcVar4->m_levels).m_buf[0];
                  bVar3 = (pcVar4->m_levels).m_buf[0];
                  uVar8 = (ulong)bVar3;
                  if (bVar3 != 0) {
                    uVar7 = 0;
                    do {
                      uVar1 = uVar7 + 1;
                      if (uVar1 < uVar8) {
                        uVar14 = *(uint *)(&pcVar4[1].m_sig + uVar7 * 2);
                      }
                      else {
                        uVar14 = *(uint *)(pcVar4->m_data_size).m_buf;
                      }
                      uVar11 = *(uint *)pcVar4->m_level_ofs[uVar7].m_buf;
                      *(uint *)(pFile_info + uVar7 * 4 + 0x18) =
                           (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                           uVar14 << 0x18) -
                           (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                           uVar11 << 0x18);
                      uVar8 = (ulong)(pcVar4->m_levels).m_buf[0];
                      uVar7 = uVar1;
                    } while (uVar1 < uVar8);
                  }
                  uVar5 = *(ushort *)(pcVar4->m_color_endpoints).m_num.m_buf;
                  *(uint *)(pFile_info + 0x58) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
                  uVar5 = *(ushort *)(pcVar4->m_color_selectors).m_num.m_buf;
                  *(uint *)(pFile_info + 0x5c) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
                  uVar5 = *(ushort *)(pcVar4->m_alpha_endpoints).m_num.m_buf;
                  *(uint *)(pFile_info + 0x60) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
                  uVar5 = *(ushort *)(pcVar4->m_alpha_selectors).m_num.m_buf;
                  *(uint *)(pFile_info + 100) = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
                  uVar13 = 1;
                }
                goto LAB_001113b6;
              }
            }
          }
        }
      }
    }
  }
  else if (*(int *)pFile_info == 0x68) {
    *(undefined8 *)(pFile_info + 0x54) = 0;
    *(undefined8 *)(pFile_info + 0x5c) = 0;
    *(undefined8 *)(pFile_info + 0x44) = 0;
    *(undefined8 *)(pFile_info + 0x4c) = 0;
    *(undefined8 *)(pFile_info + 0x34) = 0;
    *(undefined8 *)(pFile_info + 0x3c) = 0;
    *(undefined8 *)(pFile_info + 0x24) = 0;
    *(undefined8 *)(pFile_info + 0x2c) = 0;
    *(undefined8 *)(pFile_info + 0x14) = 0;
    *(undefined8 *)(pFile_info + 0x1c) = 0;
    *(undefined8 *)(pFile_info + 4) = 0;
    *(undefined8 *)(pFile_info + 0xc) = 0;
    *(undefined4 *)(pFile_info + 100) = 0;
    goto LAB_0011123f;
  }
  uVar13 = 0;
LAB_001113b6:
  return SUB41(uVar13,0);
}

Assistant:

bool crnd_validate_file(const void* pData, uint32 data_size, crn_file_info* pFile_info)
    {
        if (pFile_info)
        {
            if (pFile_info->m_struct_size != sizeof(crn_file_info))
                return false;

            memset(&pFile_info->m_struct_size + 1, 0, sizeof(crn_file_info) - sizeof(pFile_info->m_struct_size));
        }

        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return false;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return false;

        const uint32 header_crc = crc16(&pHeader->m_data_size, (uint32)(pHeader->m_header_size - ((const uint8*)&pHeader->m_data_size - (const uint8*)pHeader)));
        if (header_crc != pHeader->m_header_crc16)
            return false;

        const uint32 data_crc = crc16((const uint8*)pData + pHeader->m_header_size, pHeader->m_data_size - pHeader->m_header_size);
        if (data_crc != pHeader->m_data_crc16)
            return false;

        if ((pHeader->m_faces != 1) && (pHeader->m_faces != 6))
            return false;
        if ((pHeader->m_width < 1) || (pHeader->m_width > cCRNMaxLevelResolution))
            return false;
        if ((pHeader->m_height < 1) || (pHeader->m_height > cCRNMaxLevelResolution))
            return false;
        if ((pHeader->m_levels < 1) || (pHeader->m_levels > utils::compute_max_mips(pHeader->m_width, pHeader->m_height)))
            return false;
        if (((int)pHeader->m_format < cCRNFmtDXT1) || ((int)pHeader->m_format >= cCRNFmtTotal))
            return false;

        if (pFile_info)
        {
            pFile_info->m_actual_data_size = pHeader->m_data_size;
            pFile_info->m_header_size = pHeader->m_header_size;
            pFile_info->m_total_palette_size = pHeader->m_color_endpoints.m_size + pHeader->m_color_selectors.m_size + pHeader->m_alpha_endpoints.m_size + pHeader->m_alpha_selectors.m_size;
            pFile_info->m_tables_size = pHeader->m_tables_size;

            pFile_info->m_levels = pHeader->m_levels;

            for (uint32 i = 0; i < pHeader->m_levels; i++)
            {
                uint32 next_ofs = pHeader->m_data_size;

                // assumes the levels are packed together sequentially
                if ((i + 1) < pHeader->m_levels)
                    next_ofs = pHeader->m_level_ofs[i + 1];

                pFile_info->m_level_compressed_size[i] = next_ofs - pHeader->m_level_ofs[i];
            }

            pFile_info->m_color_endpoint_palette_entries = pHeader->m_color_endpoints.m_num;
            pFile_info->m_color_selector_palette_entries = pHeader->m_color_selectors.m_num;;
            pFile_info->m_alpha_endpoint_palette_entries = pHeader->m_alpha_endpoints.m_num;;
            pFile_info->m_alpha_selector_palette_entries = pHeader->m_alpha_selectors.m_num;;
        }

        return true;
    }